

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManPrintNpnClasses(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char **ppcVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  void *__ptr;
  int *piVar5;
  Gia_Obj_t *pRoot;
  uint *puVar6;
  long lVar7;
  Vec_Int_t **p_03;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  double dVar15;
  int ClassCounts [222];
  
  ppcVar4 = Kit_DsdNpn4ClassNames();
  memset(ClassCounts,0,0x378);
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMan.c"
                  ,0x2b1,"void Gia_ManPrintNpnClasses(Gia_Man_t *)");
  }
  iVar1 = Gia_ManLutSizeMax(p);
  if (iVar1 < 5) {
    p_00 = Vec_IntAlloc(100);
    p_01 = Vec_IntAlloc(100);
    p_02 = Vec_IntAlloc(0x10000);
    __ptr = calloc((long)p->nObjs,4);
    Gia_ManCleanTruth(p);
    for (lVar9 = 1; iVar1 = (int)lVar9, lVar9 < p->nObjs; lVar9 = lVar9 + 1) {
      iVar2 = Gia_ObjIsLut(p,iVar1);
      if (iVar2 != 0) {
        iVar2 = Gia_ObjLutSize(p,iVar1);
        if (iVar2 < 5) {
          p_00->nSize = 0;
          uVar13 = 0;
          while( true ) {
            iVar2 = Gia_ObjLutSize(p,iVar1);
            if ((long)iVar2 <= (long)uVar13) break;
            piVar5 = Gia_ObjLutFanins(p,iVar1);
            Vec_IntPush(p_00,piVar5[uVar13]);
            uVar13 = uVar13 + 1;
          }
          for (; (uint)uVar13 < 4; uVar13 = (ulong)((uint)uVar13 + 1)) {
            Vec_IntPush(p_00,0);
          }
          pRoot = Gia_ManObj(p,iVar1);
          puVar6 = Gia_ManConvertAigToTruth(p,pRoot,p_00,p_02,p_01);
          iVar1 = Dar_LibReturnClass(*puVar6);
          ClassCounts[iVar1] = ClassCounts[iVar1] + 1;
          *(int *)((long)__ptr + lVar9 * 4) = iVar1;
        }
      }
    }
    Vec_IntFree(p_00);
    Vec_IntFree(p_02);
    Vec_IntFree(p_01);
    p_03 = &p->vTruths;
    Vec_IntFreeP(p_03);
    uVar8 = 0;
    for (lVar9 = 0; lVar9 != 0xde; lVar9 = lVar9 + 1) {
      uVar8 = uVar8 + ClassCounts[lVar9];
    }
    Abc_Print((int)p_03,"NPN CLASS STATISTICS (for %d LUT4 present in the current mapping):\n",
              (ulong)uVar8);
    dVar15 = (double)(int)(uVar8 + 1);
    iVar1 = 0;
    for (uVar13 = 0; uVar13 != 0xde; uVar13 = uVar13 + 1) {
      uVar11 = ClassCounts[uVar13];
      if (uVar11 != 0) {
        iVar1 = iVar1 + uVar11;
        Abc_Print((int)p_03,"Class %3d :  Count = %6d   (%7.2f %%)   %s\n",
                  ((double)(int)uVar11 * 100.0) / dVar15,uVar13 & 0xffffffff,(ulong)uVar11,
                  ppcVar4[uVar13]);
      }
    }
    Abc_Print((int)p_03,"Other     :  Count = %6d   (%7.2f %%)\n",
              ((double)(int)(uVar8 - iVar1) * 100.0) / dVar15,(ulong)(uVar8 - iVar1));
    if (p->pRefs != (int *)0x0) {
      free(p->pRefs);
      p->pRefs = (int *)0x0;
    }
    Gia_ManSetRefsMapped(p);
    uVar8 = 0;
    uVar11 = 0;
    for (lVar9 = 1; lVar9 < p->nObjs; lVar9 = lVar9 + 1) {
      iVar2 = (int)lVar9;
      iVar1 = Gia_ObjIsLut(p,iVar2);
      if ((iVar1 != 0) && (*(int *)((long)__ptr + lVar9 * 4) == 0x6d)) {
        lVar7 = 0;
        uVar12 = 0;
        uVar10 = 0;
        while( true ) {
          iVar1 = Gia_ObjLutSize(p,iVar2);
          if (iVar1 <= lVar7) break;
          piVar5 = Gia_ObjLutFanins(p,iVar2);
          uVar3 = 0;
          bVar14 = *(int *)((long)__ptr + (long)piVar5[lVar7] * 4) == 0x6d;
          if (bVar14) {
            uVar3 = (uint)(p->pRefs[piVar5[lVar7]] == 1);
          }
          uVar12 = uVar12 + bVar14;
          uVar10 = uVar10 + uVar3;
          lVar7 = lVar7 + 1;
        }
        uVar8 = (uVar8 + 1) - (uint)(uVar12 < 2);
        uVar11 = (uVar11 + 1) - (uint)(uVar10 < 2);
      }
    }
    piVar5 = p->pRefs;
    if (piVar5 != (int *)0x0) {
      free(piVar5);
      p->pRefs = (int *)0x0;
    }
    Abc_Print((int)piVar5,
              "Approximate number of 4:1 MUX structures: All = %6d  (%7.2f %%)  MFFC = %6d  (%7.2f %%)\n"
              ,((double)(int)uVar8 * 100.0) / dVar15,((double)(int)uVar11 * 100.0) / dVar15,
              (ulong)uVar8,(ulong)uVar11);
    free(__ptr);
    return;
  }
  __assert_fail("Gia_ManLutSizeMax( p ) <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMan.c"
                ,0x2b2,"void Gia_ManPrintNpnClasses(Gia_Man_t *)");
}

Assistant:

void Gia_ManPrintNpnClasses( Gia_Man_t * p )
{
    extern char ** Kit_DsdNpn4ClassNames();
    char ** pNames = Kit_DsdNpn4ClassNames();
    Vec_Int_t * vLeaves, * vTruth, * vVisited;
    int * pLutClass, ClassCounts[222] = {0};
    int i, k, iFan, Class, OtherClasses, OtherClasses2, nTotal, Counter, Counter2;
    unsigned * pTruth;
    assert( Gia_ManHasMapping(p) );
    assert(  Gia_ManLutSizeMax( p ) <= 4 );
    vLeaves   = Vec_IntAlloc( 100 );
    vVisited  = Vec_IntAlloc( 100 );
    vTruth    = Vec_IntAlloc( (1<<16) );
    pLutClass = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManCleanTruth( p );
    Gia_ManForEachLut( p, i )
    {
        if ( Gia_ObjLutSize(p,i) > 4 )
            continue;
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, i, iFan, k )
            Vec_IntPush( vLeaves, iFan );
        for ( ; k < 4; k++ )
            Vec_IntPush( vLeaves, 0 );
        pTruth = Gia_ManConvertAigToTruth( p, Gia_ManObj(p, i), vLeaves, vTruth, vVisited );
        Class = Dar_LibReturnClass( *pTruth );
        ClassCounts[ Class ]++;
        pLutClass[i] = Class;
    }
    Vec_IntFree( vLeaves );
    Vec_IntFree( vTruth );
    Vec_IntFree( vVisited );
    Vec_IntFreeP( &p->vTruths );
    nTotal = 0;
    for ( i = 0; i < 222; i++ )
        nTotal += ClassCounts[i];
    Abc_Print( 1, "NPN CLASS STATISTICS (for %d LUT4 present in the current mapping):\n", nTotal );
    OtherClasses = 0;
    for ( i = 0; i < 222; i++ )
    {
        if ( ClassCounts[i] == 0 )
            continue;
//        if ( 100.0 * ClassCounts[i] / (nTotal+1) < 0.1 ) // do not show anything below 0.1 percent
//            continue;
        OtherClasses += ClassCounts[i];
        Abc_Print( 1, "Class %3d :  Count = %6d   (%7.2f %%)   %s\n", 
            i, ClassCounts[i], 100.0 * ClassCounts[i] / (nTotal+1), pNames[i] );
    }
    OtherClasses = nTotal - OtherClasses;
    Abc_Print( 1, "Other     :  Count = %6d   (%7.2f %%)\n", 
        OtherClasses, 100.0 * OtherClasses / (nTotal+1) );
    // count the number of LUTs that have MUX function and two fanins with MUX functions
    OtherClasses = OtherClasses2 = 0;
    ABC_FREE( p->pRefs );
    Gia_ManSetRefsMapped( p );
    Gia_ManForEachLut( p, i )
    {
        if ( pLutClass[i] != 109 )
            continue;
        Counter = Counter2 = 0;
        Gia_LutForEachFanin( p, i, iFan, k )
        {
            Counter  += (pLutClass[iFan] == 109);
            Counter2 += (pLutClass[iFan] == 109) && (Gia_ObjRefNumId(p, iFan) == 1);
        }
        OtherClasses  += (Counter > 1);
        OtherClasses2 += (Counter2 > 1);
//            Abc_Print( 1, "%d -- ", pLutClass[i] );
//            Gia_LutForEachFanin( p, i, iFan, k )
//                Abc_Print( 1, "%d ", pLutClass[iFan] );
//            Abc_Print( 1, "\n" );
    }
    ABC_FREE( p->pRefs );
    Abc_Print( 1, "Approximate number of 4:1 MUX structures: All = %6d  (%7.2f %%)  MFFC = %6d  (%7.2f %%)\n", 
        OtherClasses,  100.0 * OtherClasses  / (nTotal+1),
        OtherClasses2, 100.0 * OtherClasses2 / (nTotal+1) );
    ABC_FREE( pLutClass );
}